

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts3EvalIncrPhraseNext(Fts3Cursor *pCsr,Fts3Phrase *p,u8 *pbEof)

{
  uint uVar1;
  uint uVar2;
  char **pp2;
  undefined8 in_RDX;
  long in_RSI;
  long in_RDI;
  long in_FS_OFFSET;
  bool bVar3;
  int res;
  int nDist;
  char *aDoclist;
  int nByte;
  int nList;
  int i;
  sqlite3_int64 iMax;
  int bMaxSet;
  int bDescDoclist;
  Fts3Table *pTab;
  Fts3Doclist *pDL;
  int rc;
  char *pOut;
  char *pR;
  char *pL;
  u8 bEof;
  TokenDoclist a [4];
  undefined4 in_stack_fffffffffffffec8;
  undefined4 in_stack_fffffffffffffecc;
  int in_stack_fffffffffffffed0;
  int in_stack_fffffffffffffed4;
  int in_stack_fffffffffffffed8;
  int in_stack_fffffffffffffedc;
  int in_stack_fffffffffffffee4;
  int in_stack_fffffffffffffee8;
  uint in_stack_fffffffffffffeec;
  int in_stack_fffffffffffffef0;
  int in_stack_fffffffffffffef4;
  int *in_stack_fffffffffffffef8;
  char **ppcVar4;
  undefined4 in_stack_ffffffffffffff00;
  undefined4 in_stack_ffffffffffffff04;
  undefined4 in_stack_ffffffffffffff08;
  int iVar5;
  undefined4 in_stack_ffffffffffffff0c;
  int iVar6;
  int isExact;
  Fts3MultiSegReader *in_stack_ffffffffffffff10;
  long lVar7;
  undefined4 in_stack_ffffffffffffff18;
  int iVar8;
  undefined4 in_stack_ffffffffffffff1c;
  int local_cc;
  int local_ac;
  bool local_89;
  int local_88 [2];
  long alStack_80 [2];
  int aiStack_70 [26];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_cc = 0;
  local_89 = false;
  if (*(int *)(in_RSI + 0x50) != 1) {
    uVar2 = (uint)*(byte *)(in_RDI + 0x4c);
    memset(local_88,0xaa,0x80);
    memset(local_88,0,0x80);
    do {
      iVar8 = 0;
      lVar7 = 0;
      iVar6 = 0;
      while( true ) {
        uVar1 = in_stack_fffffffffffffeec & 0xffffff;
        if ((local_cc == 0) &&
           (uVar1 = in_stack_fffffffffffffeec & 0xffffff, iVar6 < *(int *)(in_RSI + 0x50))) {
          uVar1 = CONCAT13(1,(int3)in_stack_fffffffffffffeec);
        }
        in_stack_fffffffffffffeec = uVar1;
        if ((char)(in_stack_fffffffffffffeec >> 0x18) == '\0') break;
        local_cc = incrPhraseTokenNext((Fts3Table *)
                                       CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0)
                                       ,(Fts3Phrase *)
                                        CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8
                                                ),in_stack_fffffffffffffee4,
                                       (TokenDoclist *)
                                       CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8)
                                       ,(u8 *)CONCAT44(in_stack_fffffffffffffed4,
                                                       in_stack_fffffffffffffed0));
        if (local_88[(long)iVar6 * 8] == 0) {
          if (iVar8 != 0) {
            in_stack_fffffffffffffee8 = 1;
            if (uVar2 != 0) {
              in_stack_fffffffffffffee8 = -1;
            }
            if (alStack_80[(long)iVar6 * 4] < lVar7) {
              in_stack_fffffffffffffee4 = 1;
            }
            else {
              in_stack_fffffffffffffee4 = -1;
              if (lVar7 == alStack_80[(long)iVar6 * 4]) {
                in_stack_fffffffffffffee4 = 0;
              }
            }
            if (-1 < in_stack_fffffffffffffee8 * in_stack_fffffffffffffee4) goto LAB_00251707;
          }
          lVar7 = alStack_80[(long)iVar6 * 4];
          iVar8 = 1;
        }
LAB_00251707:
        iVar6 = iVar6 + 1;
      }
      for (iVar6 = 0; iVar6 < *(int *)(in_RSI + 0x50); iVar6 = iVar6 + 1) {
        while( true ) {
          bVar3 = false;
          if ((local_cc == 0) && (bVar3 = false, local_88[(long)iVar6 * 8] == 0)) {
            in_stack_fffffffffffffedc = 1;
            if (uVar2 != 0) {
              in_stack_fffffffffffffedc = -1;
            }
            if (lVar7 < alStack_80[(long)iVar6 * 4]) {
              in_stack_fffffffffffffed8 = 1;
            }
            else {
              in_stack_fffffffffffffed8 = -1;
              if (alStack_80[(long)iVar6 * 4] == lVar7) {
                in_stack_fffffffffffffed8 = 0;
              }
            }
            bVar3 = in_stack_fffffffffffffedc * in_stack_fffffffffffffed8 < 0;
          }
          if (!bVar3) break;
          local_cc = incrPhraseTokenNext((Fts3Table *)
                                         CONCAT44(in_stack_fffffffffffffef4,
                                                  in_stack_fffffffffffffef0),
                                         (Fts3Phrase *)
                                         CONCAT44(in_stack_fffffffffffffeec,
                                                  in_stack_fffffffffffffee8),
                                         in_stack_fffffffffffffee4,
                                         (TokenDoclist *)
                                         CONCAT44(in_stack_fffffffffffffedc,
                                                  in_stack_fffffffffffffed8),
                                         (u8 *)CONCAT44(in_stack_fffffffffffffed4,
                                                        in_stack_fffffffffffffed0));
          in_stack_fffffffffffffed4 = 1;
          if (uVar2 != 0) {
            in_stack_fffffffffffffed4 = -1;
          }
          if (lVar7 < alStack_80[(long)iVar6 * 4]) {
            in_stack_fffffffffffffed0 = 1;
          }
          else {
            in_stack_fffffffffffffed0 = -1;
            if (alStack_80[(long)iVar6 * 4] == lVar7) {
              in_stack_fffffffffffffed0 = 0;
            }
          }
          if (0 < in_stack_fffffffffffffed4 * in_stack_fffffffffffffed0) {
            lVar7 = alStack_80[(long)iVar6 * 4];
            iVar6 = 0;
          }
        }
      }
      iVar5 = 0;
      iVar6 = aiStack_70[(long)(*(int *)(in_RSI + 0x50) + -1) * 8];
      pp2 = (char **)sqlite3_malloc64(CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8))
      ;
      if (pp2 == (char **)0x0) {
        local_ac = 7;
        goto LAB_00251b0e;
      }
      memcpy(pp2,(void *)alStack_80[(long)(*(int *)(in_RSI + 0x50) + -1) * 4 + 1],(long)(iVar6 + 1))
      ;
      memset((void *)((long)pp2 + (long)iVar6),0,8);
      for (isExact = 0; ppcVar4 = pp2, isExact < *(int *)(in_RSI + 0x50) + -1; isExact = isExact + 1
          ) {
        if (local_88[(long)isExact * 8] == 0) {
          in_stack_fffffffffffffef4 = (*(int *)(in_RSI + 0x50) + -1) - isExact;
          in_stack_fffffffffffffef0 =
               fts3PoslistPhraseMerge
                         ((char **)CONCAT44(uVar2,iVar8),(int)((ulong)lVar7 >> 0x20),(int)lVar7,
                          isExact,(char **)CONCAT44(iVar6,in_stack_ffffffffffffff00),pp2);
          if (in_stack_fffffffffffffef0 == 0) break;
          iVar5 = (int)pp2 - (int)ppcVar4;
        }
        pp2 = ppcVar4;
      }
      if (isExact == *(int *)(in_RSI + 0x50) + -1) goto code_r0x00251aae;
      sqlite3_free((void *)0x251aee);
    } while( true );
  }
  local_cc = sqlite3Fts3MsrIncrNext
                       ((Fts3Table *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
                        in_stack_ffffffffffffff10,
                        (sqlite3_int64 *)
                        CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
                        (char **)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
                        in_stack_fffffffffffffef8);
  local_89 = *(long *)(in_RSI + 0x28) == 0;
LAB_00251af5:
  *(bool *)in_RDX = local_89;
  local_ac = local_cc;
LAB_00251b0e:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_ac;
  }
  __stack_chk_fail();
code_r0x00251aae:
  *(long *)(in_RSI + 0x18) = lVar7;
  *(char ***)(in_RSI + 0x28) = ppcVar4;
  *(int *)(in_RSI + 0x30) = iVar5;
  *(undefined4 *)(in_RSI + 0x20) = 1;
  goto LAB_00251af5;
}

Assistant:

static int fts3EvalIncrPhraseNext(
  Fts3Cursor *pCsr,               /* FTS Cursor handle */
  Fts3Phrase *p,                  /* Phrase object to advance to next docid */
  u8 *pbEof                       /* OUT: Set to 1 if EOF */
){
  int rc = SQLITE_OK;
  Fts3Doclist *pDL = &p->doclist;
  Fts3Table *pTab = (Fts3Table *)pCsr->base.pVtab;
  u8 bEof = 0;

  /* This is only called if it is guaranteed that the phrase has at least
  ** one incremental token. In which case the bIncr flag is set. */
  assert( p->bIncr==1 );

  if( p->nToken==1 ){
    rc = sqlite3Fts3MsrIncrNext(pTab, p->aToken[0].pSegcsr,
        &pDL->iDocid, &pDL->pList, &pDL->nList
    );
    if( pDL->pList==0 ) bEof = 1;
  }else{
    int bDescDoclist = pCsr->bDesc;
    struct TokenDoclist a[MAX_INCR_PHRASE_TOKENS];

    memset(a, 0, sizeof(a));
    assert( p->nToken<=MAX_INCR_PHRASE_TOKENS );
    assert( p->iDoclistToken<MAX_INCR_PHRASE_TOKENS );

    while( bEof==0 ){
      int bMaxSet = 0;
      sqlite3_int64 iMax = 0;     /* Largest docid for all iterators */
      int i;                      /* Used to iterate through tokens */

      /* Advance the iterator for each token in the phrase once. */
      for(i=0; rc==SQLITE_OK && i<p->nToken && bEof==0; i++){
        rc = incrPhraseTokenNext(pTab, p, i, &a[i], &bEof);
        if( a[i].bIgnore==0 && (bMaxSet==0 || DOCID_CMP(iMax, a[i].iDocid)<0) ){
          iMax = a[i].iDocid;
          bMaxSet = 1;
        }
      }
      assert( rc!=SQLITE_OK || (p->nToken>=1 && a[p->nToken-1].bIgnore==0) );
      assert( rc!=SQLITE_OK || bMaxSet );

      /* Keep advancing iterators until they all point to the same document */
      for(i=0; i<p->nToken; i++){
        while( rc==SQLITE_OK && bEof==0
            && a[i].bIgnore==0 && DOCID_CMP(a[i].iDocid, iMax)<0
        ){
          rc = incrPhraseTokenNext(pTab, p, i, &a[i], &bEof);
          if( DOCID_CMP(a[i].iDocid, iMax)>0 ){
            iMax = a[i].iDocid;
            i = 0;
          }
        }
      }

      /* Check if the current entries really are a phrase match */
      if( bEof==0 ){
        int nList = 0;
        int nByte = a[p->nToken-1].nList;
        char *aDoclist = sqlite3_malloc64((i64)nByte+FTS3_BUFFER_PADDING);
        if( !aDoclist ) return SQLITE_NOMEM;
        memcpy(aDoclist, a[p->nToken-1].pList, nByte+1);
        memset(&aDoclist[nByte], 0, FTS3_BUFFER_PADDING);

        for(i=0; i<(p->nToken-1); i++){
          if( a[i].bIgnore==0 ){
            char *pL = a[i].pList;
            char *pR = aDoclist;
            char *pOut = aDoclist;
            int nDist = p->nToken-1-i;
            int res = fts3PoslistPhraseMerge(&pOut, nDist, 0, 1, &pL, &pR);
            if( res==0 ) break;
            nList = (int)(pOut - aDoclist);
          }
        }
        if( i==(p->nToken-1) ){
          pDL->iDocid = iMax;
          pDL->pList = aDoclist;
          pDL->nList = nList;
          pDL->bFreeList = 1;
          break;
        }
        sqlite3_free(aDoclist);
      }
    }
  }

  *pbEof = bEof;
  return rc;
}